

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::SkipMessage
               (CodedInputStream *input,CodedOutputStream *output)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  byte unaff_R15B;
  
  do {
    pbVar5 = input->buffer_;
    if (pbVar5 < input->buffer_end_) {
      bVar1 = *pbVar5;
      uVar7 = (ulong)bVar1;
      uVar3 = (uint32_t)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003a052a;
      input->buffer_ = pbVar5 + 1;
    }
    else {
      uVar3 = 0;
LAB_003a052a:
      uVar3 = io::CodedInputStream::ReadTagFallback(input,uVar3);
      uVar7 = (ulong)uVar3;
    }
    uVar6 = (uint)uVar7;
    input->last_tag_ = uVar6;
    if (uVar6 == 0) {
LAB_003a05b8:
      bVar2 = false;
      unaff_R15B = true;
    }
    else {
      if ((uVar6 & 7) == 4) {
        pbVar5 = output->cur_;
        if ((output->impl_).end_ <= pbVar5) {
          pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar5);
        }
        output->cur_ = pbVar5;
        *pbVar5 = (byte)uVar7;
        if (uVar6 < 0x80) {
          pbVar4 = pbVar5 + 1;
        }
        else {
          *pbVar5 = (byte)uVar7 | 0x80;
          pbVar5[1] = (byte)(uVar7 >> 7);
          pbVar4 = pbVar5 + 2;
          if (0x3fff < uVar6) {
            uVar8 = (ulong)pbVar5[1];
            uVar7 = uVar7 >> 7;
            do {
              pbVar4[-1] = (byte)uVar8 | 0x80;
              uVar8 = uVar7 >> 7;
              *pbVar4 = (byte)uVar8;
              pbVar4 = pbVar4 + 1;
              uVar6 = (uint)uVar7;
              uVar7 = uVar8;
            } while (0x3fff < uVar6);
          }
        }
        output->cur_ = pbVar4;
        goto LAB_003a05b8;
      }
      bVar2 = SkipField(input,uVar6,output);
      unaff_R15B = unaff_R15B & bVar2;
    }
    if (bVar2 == false) {
      return (bool)unaff_R15B;
    }
  } while( true );
}

Assistant:

bool WireFormatLite::SkipMessage(io::CodedInputStream* input,
                                 io::CodedOutputStream* output) {
  while (true) {
    uint32_t tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      output->WriteVarint32(tag);
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag, output)) return false;
  }
}